

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_creature_abstract::state_read
          (cse_alife_creature_abstract *this,xr_packet *packet,uint16_t size)

{
  undefined8 uVar1;
  ushort uVar2;
  uint uVar3;
  
  cse_alife_dynamic_object_visual::state_read((cse_alife_dynamic_object_visual *)this,packet,0);
  xr_packet::r<unsigned_char>(packet,&this->m_s_team);
  xr_packet::r<unsigned_char>(packet,&this->m_s_squad);
  xr_packet::r<unsigned_char>(packet,&this->m_s_group);
  uVar2 = *(ushort *)&this->field_0x28;
  if (uVar2 < 0x13) {
LAB_0014ad0b:
    this->m_health = this->m_health * 0.01;
    if (uVar2 < 0x20) {
      cse_visual::visual_read((cse_visual *)&this->field_0x118,packet,uVar2);
      uVar2 = *(ushort *)&this->field_0x28;
    }
    if (uVar2 < 0x58) goto LAB_0014adbd;
  }
  else {
    xr_packet::r<float>(packet,&this->m_health);
    uVar2 = *(ushort *)&this->field_0x28;
    if (uVar2 < 0x73) goto LAB_0014ad0b;
  }
  uVar3 = xr_packet::r<unsigned_int>(packet);
  xr_packet::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
            (packet,(ulong)uVar3,&this->m_dynamic_out_restrictions);
  uVar3 = xr_packet::r<unsigned_int>(packet);
  xr_packet::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
            (packet,(ulong)uVar3,&this->m_dynamic_in_restrictions);
  if (0x5e < *(ushort *)&this->field_0x28) {
    xr_packet::r<unsigned_short>(packet,&this->m_killer_id);
    uVar2 = *(ushort *)&this->field_0x28;
    uVar1 = *(undefined8 *)&this->field_0x6c;
    (this->m_o_torso).yaw = (float)(int)((ulong)uVar1 >> 0x20);
    (this->m_o_torso).pitch = (float)(int)uVar1;
    if (uVar2 < 0x74) {
      return;
    }
    xr_packet::r<unsigned_long>(packet,&this->m_game_death_time);
    return;
  }
LAB_0014adbd:
  uVar1 = *(undefined8 *)&this->field_0x6c;
  (this->m_o_torso).yaw = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_o_torso).pitch = (float)(int)uVar1;
  return;
}

Assistant:

void cse_alife_creature_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	packet.r_u8(m_s_team);
	packet.r_u8(m_s_squad);
	packet.r_u8(m_s_group);
	if (m_version > CSE_VERSION_0x12)
		packet.r_float(m_health);
	if (m_version < CSE_VERSION_0x73)
		m_health *= 0.01f;
	if (m_version < CSE_VERSION_0x20)
		cse_visual::visual_read(packet, m_version);
	if (m_version > CSE_VERSION_0x57) {
		packet.r_seq(packet.r_u32(), m_dynamic_out_restrictions);
		packet.r_seq(packet.r_u32(), m_dynamic_in_restrictions);
	}
	if (m_version > CSE_VERSION_0x5e)
		packet.r_u16(m_killer_id);
	m_o_torso.yaw = m_o_angle.y;
	m_o_torso.pitch = m_o_angle.x;
	if (m_version > CSE_VERSION_0x73)
		packet.r_u64(m_game_death_time);
}